

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O1

bool __thiscall SDLVideo::NextMode(SDLVideo *this,int *width,int *height,bool *letterbox)

{
  if ((this->IteratorBits == 8) && ((ulong)(uint)this->IteratorMode < 0x3e)) {
    *width = (uint)WinModes[(uint)this->IteratorMode].Width;
    *height = (uint)WinModes[this->IteratorMode].Height;
    this->IteratorMode = this->IteratorMode + 1;
    return true;
  }
  return false;
}

Assistant:

bool SDLVideo::NextMode (int *width, int *height, bool *letterbox)
{
	if (IteratorBits != 8)
		return false;

	if ((unsigned)IteratorMode < sizeof(WinModes)/sizeof(WinModes[0]))
	{
		*width = WinModes[IteratorMode].Width;
		*height = WinModes[IteratorMode].Height;
		++IteratorMode;
		return true;
	}
	return false;
}